

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O1

string * __thiscall libDAI::TRW::identify_abi_cxx11_(string *__return_storage_ptr__,TRW *this)

{
  undefined *puVar1;
  size_t sVar2;
  stringstream result;
  stringstream asStack_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8,_S_out);
  puVar1 = Name;
  if (Name == (undefined *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar2 = strlen(Name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,puVar1,sVar2);
  }
  libDAI::operator<<((ostream *)local_198,
                     &(this->super_DAIAlgFG).super_InferenceAlgorithm._properties);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string TRW::identify() const { 
        stringstream result (stringstream::out);
        result << Name << GetProperties();
        return result.str();
    }